

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8_int8.h
# Opt level: O2

void ncnn::padding_constant_pack8_int8_sse
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int64_t _v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int64_t *piVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  pvVar6 = src->data;
  iVar3 = 0;
  iVar2 = dst->w;
  if (dst->w < 1) {
    iVar2 = 0;
  }
  piVar5 = (int64_t *)dst->data;
  if (top < 1) {
    top = iVar3;
  }
  for (; iVar1 = iVar2, iVar3 != top; iVar3 = iVar3 + 1) {
    while (iVar1 != 0) {
      *piVar5 = _v;
      piVar5 = piVar5 + 1;
      iVar1 = iVar1 + -1;
    }
  }
  if (left < 1) {
    left = 0;
  }
  iVar2 = src->w;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  if (right < 1) {
    right = 0;
  }
  iVar3 = src->h;
  iVar1 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
    iVar1 = 0;
  }
  for (; iVar4 = left, iVar1 != iVar3; iVar1 = iVar1 + 1) {
    while (iVar4 != 0) {
      *piVar5 = _v;
      piVar5 = piVar5 + 1;
      iVar4 = iVar4 + -1;
    }
    lVar7 = 0;
    for (lVar8 = 0; iVar2 != (int)lVar8; lVar8 = lVar8 + 1) {
      piVar5[lVar8] = *(int64_t *)((long)pvVar6 + lVar8 * 8);
      lVar7 = lVar7 + -8;
    }
    pvVar6 = (void *)((long)pvVar6 - lVar7);
    piVar5 = (int64_t *)((long)piVar5 - lVar7);
    iVar4 = right;
    while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
      *piVar5 = _v;
      piVar5 = piVar5 + 1;
    }
  }
  iVar3 = 0;
  iVar2 = dst->w;
  if (dst->w < 1) {
    iVar2 = 0;
  }
  if (bottom < 1) {
    bottom = iVar3;
  }
  for (; iVar1 = iVar2, iVar3 != bottom; iVar3 = iVar3 + 1) {
    while (bVar9 = iVar1 != 0, iVar1 = iVar1 + -1, bVar9) {
      *piVar5 = _v;
      piVar5 = piVar5 + 1;
    }
  }
  return;
}

Assistant:

static void padding_constant_pack8_int8_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int64_t _v)
{
    const int64_t* ptr = src;
    int64_t* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            *outptr++ = _v;
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill bottom
    for (int y = 0; y < bottom; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
}